

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bash_hash.c
# Opt level: O1

void bashHashStepG_internal(size_t hash_len,void *state)

{
  octet *block;
  long lVar1;
  
  block = (octet *)(hash_len + 0xc0);
  memCopy(block,(void *)hash_len,0xc0);
  lVar1 = *(long *)(hash_len + 0x188);
  if (lVar1 == 0) {
    memSet(block,'\0',*(size_t *)(hash_len + 0x180));
    *(undefined1 *)(hash_len + 0xc0) = 0x40;
  }
  else {
    memSet(block + lVar1,'\0',*(long *)(hash_len + 0x180) - lVar1);
    *(undefined1 *)(hash_len + 0xc0 + *(long *)(hash_len + 0x188)) = 0x40;
  }
  bashF(block,(void *)(hash_len + 400));
  return;
}

Assistant:

static void bashHashStepG_internal(size_t hash_len, void* state)
{
	bash_hash_st* st = (bash_hash_st*)state;
	ASSERT(memIsValid(st, bashHash_keep()));
	ASSERT(st->buf_len + hash_len * 2 <= 192);
	// создать копию s
	memCopy(st->s1, st->s, sizeof(st->s));
	// есть необработанные данные?
	if (st->pos)
	{
		memSetZero(st->s1 + st->pos, st->buf_len - st->pos);
		st->s1[st->pos] = 0x40;
	}
	// дополнительный блок
	else
	{
		memSetZero(st->s1, st->buf_len);
		st->s1[0] = 0x40;
	}
	// последний шаг
	bashF(st->s1, st->stack);
}